

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_BbrdatasetSet_Test::~InterpreterTestSuite_PC_BbrdatasetSet_Test
          (InterpreterTestSuite_PC_BbrdatasetSet_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BbrdatasetSet)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, SetBbrDataset(_)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("bbrdataset set '{}'");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("bbrdataset set 'invalid-json'");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
}